

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRCodecMode.cpp
# Opt level: O2

CodecMode ZXing::QRCode::CodecModeForBits(int bits,Type type)

{
  ulong uVar1;
  long *plVar2;
  undefined *puVar3;
  uint uVar4;
  allocator<char> local_31;
  uint *local_30;
  long local_28;
  uint local_20;
  undefined4 uStack_1c;
  undefined4 uStack_18;
  undefined4 uStack_14;
  
  if (type == rMQR) {
    if (7 < bits) goto LAB_0018aae9;
    uVar1 = (ulong)bits;
    puVar3 = &DAT_001a7040;
  }
  else if (type == Micro) {
    if (3 < bits) {
LAB_0018aae9:
      plVar2 = (long *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"Invalid codec mode",&local_31);
      *plVar2 = (long)(plVar2 + 2);
      if (local_30 == &local_20) {
        *(uint *)(plVar2 + 2) = local_20;
        *(undefined4 *)((long)plVar2 + 0x14) = uStack_1c;
        *(undefined4 *)(plVar2 + 3) = uStack_18;
        *(undefined4 *)((long)plVar2 + 0x1c) = uStack_14;
      }
      else {
        *plVar2 = (long)local_30;
        plVar2[2] = CONCAT44(uStack_1c,local_20);
      }
      plVar2[1] = local_28;
      local_28 = 0;
      local_20 = local_20 & 0xffffff00;
      plVar2[4] = (long)"src/qrcode/QRCodecMode.cpp";
      *(undefined2 *)(plVar2 + 5) = 0x24;
      *(undefined1 *)((long)plVar2 + 0x2a) = 1;
      local_30 = &local_20;
      __cxa_throw(plVar2,&Error::typeinfo,Error::~Error);
    }
    uVar1 = (ulong)bits;
    puVar3 = &DAT_001a6fb0;
  }
  else {
    if ((uint)bits < 6) {
      return bits;
    }
    uVar4 = bits - 7;
    if ((6 < uVar4) || ((0x47U >> (uVar4 & 0x1f) & 1) == 0)) goto LAB_0018aae9;
    uVar1 = (ulong)uVar4;
    puVar3 = &DAT_001a7020;
  }
  return *(CodecMode *)(puVar3 + uVar1 * 4);
}

Assistant:

CodecMode CodecModeForBits(int bits, Type type)
{
	if (type == Type::Micro) {
		constexpr CodecMode Bits2Mode[4] = {CodecMode::NUMERIC, CodecMode::ALPHANUMERIC, CodecMode::BYTE, CodecMode::KANJI};
		if (bits < Size(Bits2Mode))
			return Bits2Mode[bits];
	} else if (type == Type::rMQR) {
		constexpr CodecMode Bits2Mode[8] = {
			CodecMode::TERMINATOR, CodecMode::NUMERIC, CodecMode::ALPHANUMERIC, CodecMode::BYTE,
			CodecMode::KANJI, CodecMode::FNC1_FIRST_POSITION, CodecMode::FNC1_SECOND_POSITION, CodecMode::ECI
		};
		if (bits < Size(Bits2Mode))
			return Bits2Mode[bits];
	} else {
		if ((bits >= 0x00 && bits <= 0x05) || (bits >= 0x07 && bits <= 0x09) || bits == 0x0d)
			return static_cast<CodecMode>(bits);
	}

	throw FormatError("Invalid codec mode");
}